

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O3

word zzModW(word *a,size_t n,word w)

{
  long lVar1;
  word wVar2;
  
  if (n != 0) {
    wVar2 = 0;
    do {
      lVar1 = n - 1;
      n = n - 1;
      wVar2 = __umodti3(a[lVar1],wVar2,w,0);
    } while (n != 0);
    return wVar2;
  }
  return 0;
}

Assistant:

word zzModW(const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsValid(a, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}